

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O3

int supports_full_hd(char *monitor)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  
  iVar5 = 0;
  object = cJSON_ParseWithOpts(monitor,(char **)0x0,0);
  if (object == (cJSON *)0x0) {
    if (global_error_0 != 0) {
      supports_full_hd_cold_1();
    }
  }
  else {
    pcVar1 = get_object_item(object,"name",1);
    if (((pcVar1 != (cJSON *)0x0) && ((char)pcVar1->type == '\x10')) &&
       (pcVar1->valuestring != (char *)0x0)) {
      printf("Checking monitor \"%s\"\n");
    }
    pcVar1 = get_object_item(object,"resolutions",1);
    iVar4 = 0;
    iVar5 = 0;
    if (pcVar1 != (cJSON *)0x0) {
      for (pcVar1 = pcVar1->child; iVar5 = iVar4, pcVar1 != (cJSON *)0x0; pcVar1 = pcVar1->next) {
        pcVar2 = get_object_item(pcVar1,"width",1);
        pcVar3 = get_object_item(pcVar1,"height",1);
        if (((pcVar2 == (cJSON *)0x0) || ((char)pcVar2->type != '\b')) ||
           ((pcVar3 == (cJSON *)0x0 || ((char)pcVar3->type != '\b')))) break;
        dVar6 = ABS(pcVar2->valuedouble);
        if (dVar6 <= 1920.0) {
          dVar6 = 1920.0;
        }
        if (ABS(pcVar2->valuedouble + -1920.0) <= dVar6 * 2.220446049250313e-16) {
          dVar6 = ABS(pcVar3->valuedouble);
          if (dVar6 <= 1080.0) {
            dVar6 = 1080.0;
          }
          if (ABS(pcVar3->valuedouble + -1080.0) <= dVar6 * 2.220446049250313e-16) {
            iVar5 = 1;
            break;
          }
        }
      }
    }
  }
  cJSON_Delete(object);
  return iVar5;
}

Assistant:

static int supports_full_hd(const char * const monitor)
{
    const cJSON *resolution = NULL;
    const cJSON *resolutions = NULL;
    const cJSON *name = NULL;
    int status = 0;
    cJSON *monitor_json = cJSON_Parse(monitor);
    if (monitor_json == NULL)
    {
        const char *error_ptr = cJSON_GetErrorPtr();
        if (error_ptr != NULL)
        {
            fprintf(stderr, "Error before: %s\n", error_ptr);
        }
        status = 0;
        goto end;
    }

    name = cJSON_GetObjectItemCaseSensitive(monitor_json, "name");
    if (cJSON_IsString(name) && (name->valuestring != NULL))
    {
        printf("Checking monitor \"%s\"\n", name->valuestring);
    }

    resolutions = cJSON_GetObjectItemCaseSensitive(monitor_json, "resolutions");
    cJSON_ArrayForEach(resolution, resolutions)
    {
        cJSON *width = cJSON_GetObjectItemCaseSensitive(resolution, "width");
        cJSON *height = cJSON_GetObjectItemCaseSensitive(resolution, "height");

        if (!cJSON_IsNumber(width) || !cJSON_IsNumber(height))
        {
            status = 0;
            goto end;
        }

        if (compare_double(width->valuedouble, 1920) && compare_double(height->valuedouble, 1080))
        {
            status = 1;
            goto end;
        }
    }

end:
    cJSON_Delete(monitor_json);
    return status;
}